

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  byte *pbVar1;
  int iVar2;
  Select *pSVar3;
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  Select *pSVar7;
  Select *pSVar8;
  int iVar9;
  
  if (p->pPrior != (Select *)0x0) {
    pcVar6 = "ORDER BY";
    pSVar3 = p;
    pSVar8 = (Select *)0x0;
    iVar2 = 1;
    do {
      iVar9 = iVar2;
      pSVar7 = pSVar3;
      pSVar7->pNext = pSVar8;
      pbVar1 = (byte *)((long)&pSVar7->selFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      pSVar3 = pSVar7->pPrior;
      if (pSVar3 == (Select *)0x0) goto LAB_001697ea;
      if (pSVar3->pOrderBy != (ExprList *)0x0) goto LAB_001697b7;
      pSVar8 = pSVar7;
      iVar2 = iVar9 + 1;
    } while (pSVar3->pLimit == (Expr *)0x0);
    pcVar6 = "LIMIT";
LAB_001697b7:
    bVar4 = pSVar7->op + 0x78;
    if (bVar4 < 3) {
      pcVar5 = (&PTR_anon_var_dwarf_7cd09_0023c730)[bVar4];
    }
    else {
      pcVar5 = "UNION";
    }
    iVar9 = iVar9 + 1;
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar6,pcVar5);
LAB_001697ea:
    if ((((p->selFlags & 0x600) == 0) && (iVar2 = pParse->db->aLimit[4], 0 < iVar2)) &&
       (iVar2 < iVar9)) {
      sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
      return;
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    assert( p!=0 );
    if( p->pPrior ){
      Select *pNext = 0, *pLoop = p;
      int mxSelect, cnt = 1;
      while(1){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
        pNext = pLoop;
        pLoop = pLoop->pPrior;
        if( pLoop==0 ) break;
        cnt++;
        if( pLoop->pOrderBy || pLoop->pLimit ){
          sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
             pLoop->pOrderBy!=0 ? "ORDER BY" : "LIMIT",
             sqlite3SelectOpName(pNext->op));
          break;
        }
      }
      if( (p->selFlags & (SF_MultiValue|SF_Values))==0
       && (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0
       && cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }